

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

int jump_label(char *src,char *base)

{
  short sVar1;
  byte bVar2;
  long lVar3;
  
  do {
    bVar2 = *src;
    if (bVar2 == 0) {
      return 0;
    }
    if (bVar2 < 0x40) {
      sVar1 = 0;
      do {
        sVar1 = sVar1 + (ushort)bVar2 + 1;
        lVar3 = (long)sVar1;
        bVar2 = ((byte *)src)[lVar3];
        if (bVar2 == 0) {
          return (int)sVar1;
        }
      } while (bVar2 < 0x40);
    }
    else {
      lVar3 = 0;
    }
    src = base + (ushort)((*(ushort *)((byte *)src + lVar3) & 0xff3f) << 8 |
                         *(ushort *)((byte *)src + lVar3) >> 8);
  } while( true );
}

Assistant:

int jump_label(char *src, char *base){
  short now = 0;
  short i = 0;
  short next = 0;
  while (src[now] != 0) {
    // printf("%d ",now);fflush(stdout);
    if (is_compress(src[now])) {
      unsigned short pos =
          get_compress_pos(ntohs(*(const unsigned short *)(src + now)));
      // printf("pos=%d ",pos);fflush(stdout);
      next = now + 2;
      return jump_label(base + pos, base);
    } else {
      // printf(" bbb ");fflush(stdout);
      now += src[now] + 1;
    }
  }
  next = now;
  return next;
}